

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O2

int b_or(lua_State *L)

{
  int iVar1;
  lua_Unsigned lVar2;
  uint u;
  int narg;
  
  iVar1 = lua_gettop(L);
  u = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  for (narg = 1; narg - iVar1 != 1; narg = narg + 1) {
    lVar2 = luaL_checkunsigned(L,narg);
    u = u | lVar2;
  }
  lua_pushunsigned(L,u);
  return 1;
}

Assistant:

static int b_or (lua_State *L) {
  int i, n = lua_gettop(L);
  b_uint r = 0;
  for (i = 1; i <= n; i++)
    r |= luaL_checkunsigned(L, i);
  lua_pushunsigned(L, trim(r));
  return 1;
}